

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O1

int crnlib::LzmaDec_DecodeReal2(CLzmaDec *p,SizeT limit,Byte *bufLimit)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  UInt16 *pUVar5;
  Byte *pBVar6;
  short sVar7;
  bool bVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  Byte *pBVar18;
  uint uVar19;
  UInt16 *pUVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  byte *pbVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ushort *puVar30;
  ulong uVar31;
  SizeT SVar32;
  UInt32 UVar33;
  ulong uVar34;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  ulong local_90;
  
  do {
    uVar4 = p->checkDicSize;
    local_90 = limit;
    if ((uVar4 == 0) &&
       (uVar17 = (ulong)((p->prop).dicSize - p->processedPos), local_90 = p->dicPos + uVar17,
       limit - p->dicPos <= uVar17)) {
      local_90 = limit;
    }
    pUVar5 = p->probs;
    uVar28 = p->state;
    local_d4 = p->reps[0];
    uVar10 = (p->prop).pb;
    local_cc = p->reps[1];
    local_d0 = p->reps[2];
    uVar11 = (p->prop).lp;
    local_c8 = p->reps[3];
    pBVar6 = p->dic;
    uVar17 = p->dicBufSize;
    SVar32 = p->dicPos;
    UVar33 = p->processedPos;
    pbVar24 = p->buf;
    bVar2 = (byte)(p->prop).lc;
    uVar25 = p->range;
    uVar13 = p->code;
    uVar22 = 0;
LAB_00193a32:
    uVar27 = local_c8;
    uVar15 = local_d4;
    if (uVar25 < 0x1000000) {
      uVar25 = uVar25 << 8;
      bVar1 = *pbVar24;
      pbVar24 = pbVar24 + 1;
      uVar13 = (uint)bVar1 | uVar13 << 8;
    }
    uVar19 = UVar33 & ~(-1 << ((byte)uVar10 & 0x1f));
    uVar29 = (ulong)uVar19;
    uVar31 = (ulong)(uVar28 << 4);
    uVar3 = pUVar5[uVar31 + uVar29];
    uVar14 = (uVar25 >> 0xb) * (uint)uVar3;
    uVar23 = uVar13 - uVar14;
    if (uVar13 < uVar14) {
      pUVar5[uVar31 + uVar29] = (short)(0x800 - uVar3 >> 5) + uVar3;
      pUVar20 = pUVar5 + 0x736;
      if (UVar33 != 0 || uVar4 != 0) {
        uVar29 = SVar32;
        if (SVar32 == 0) {
          uVar29 = uVar17;
        }
        pUVar20 = pUVar5 + 0x736 +
                  ((uint)(pBVar6[uVar29 - 1] >> (8 - bVar2 & 0x1f)) +
                  ((UVar33 & ~(-1 << ((byte)uVar11 & 0x1f))) << (bVar2 & 0x1f))) * 0x300;
      }
      uVar25 = uVar14;
      if (uVar28 < 7) {
        uVar29 = 1;
        do {
          uVar15 = uVar25;
          if (uVar25 < 0x1000000) {
            uVar15 = uVar25 << 8;
            bVar1 = *pbVar24;
            pbVar24 = pbVar24 + 1;
            uVar13 = uVar13 << 8 | (uint)bVar1;
          }
          uVar3 = pUVar20[uVar29];
          uVar25 = (uVar15 >> 0xb) * (uint)uVar3;
          uVar27 = (int)uVar29 * 2;
          uVar23 = uVar13 - uVar25;
          if (uVar13 < uVar25) {
            pUVar20[uVar29] = (short)(0x800 - uVar3 >> 5) + uVar3;
          }
          else {
            uVar25 = uVar15 - uVar25;
            pUVar20[uVar29] = uVar3 - (uVar3 >> 5);
            uVar27 = uVar27 | 1;
            uVar13 = uVar23;
          }
          uVar29 = (ulong)uVar27;
        } while (uVar27 < 0x100);
      }
      else {
        uVar29 = 0;
        if (SVar32 < local_d4) {
          uVar29 = uVar17;
        }
        uVar15 = (uint)p->dic[uVar29 + (SVar32 - local_d4)];
        uVar27 = 0x100;
        uVar29 = 1;
        do {
          uVar23 = uVar13;
          uVar14 = uVar25;
          if (uVar25 < 0x1000000) {
            uVar14 = uVar25 << 8;
            bVar1 = *pbVar24;
            pbVar24 = pbVar24 + 1;
            uVar23 = uVar13 << 8 | (uint)bVar1;
          }
          uVar15 = uVar15 * 2;
          uVar21 = uVar15 & uVar27;
          uVar31 = (ulong)uVar21;
          uVar3 = pUVar20[(ulong)uVar27 + uVar31 + uVar29];
          uVar25 = (uVar14 >> 0xb) * (uint)uVar3;
          uVar19 = (int)uVar29 * 2;
          uVar13 = uVar23 - uVar25;
          if (uVar23 < uVar25) {
            pUVar20[(ulong)uVar27 + uVar31 + uVar29] = (short)(0x800 - uVar3 >> 5) + uVar3;
            uVar13 = uVar23;
            uVar27 = uVar21 ^ uVar27;
          }
          else {
            uVar25 = uVar14 - uVar25;
            pUVar20[(ulong)uVar27 + uVar31 + uVar29] = uVar3 - (uVar3 >> 5);
            uVar19 = uVar19 | 1;
            uVar27 = uVar21;
          }
          uVar29 = (ulong)uVar19;
        } while (uVar19 < 0x100);
      }
      pBVar6[SVar32] = (Byte)uVar29;
      uVar28 = (uint)(byte)kLiteralNextStates[uVar28];
LAB_00193ca9:
      UVar33 = UVar33 + 1;
      SVar32 = SVar32 + 1;
      cVar12 = '\x03';
    }
    else {
      uVar25 = uVar25 - uVar14;
      pUVar5[uVar31 + uVar29] = uVar3 - (uVar3 >> 5);
      if (uVar25 < 0x1000000) {
        uVar25 = uVar25 * 0x100;
        bVar1 = *pbVar24;
        pbVar24 = pbVar24 + 1;
        uVar23 = uVar23 * 0x100 | (uint)bVar1;
      }
      uVar3 = pUVar5[(ulong)uVar28 + 0xc0];
      uVar14 = (uVar25 >> 0xb) * (uint)uVar3;
      uVar13 = uVar23 - uVar14;
      if (uVar23 < uVar14) {
        pUVar5[(ulong)uVar28 + 0xc0] = (short)(0x800 - uVar3 >> 5) + uVar3;
        uVar28 = uVar28 + 0xc;
        puVar30 = pUVar5 + 0x332;
      }
      else {
        uVar25 = uVar25 - uVar14;
        pUVar5[(ulong)uVar28 + 0xc0] = uVar3 - (uVar3 >> 5);
        if (UVar33 == 0 && uVar4 == 0) {
          cVar12 = '\x01';
          UVar33 = 0;
          goto LAB_001946d1;
        }
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 * 0x100;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar13 = (uint)bVar1 | uVar13 * 0x100;
        }
        uVar3 = pUVar5[(ulong)uVar28 + 0xcc];
        uVar14 = (uVar25 >> 0xb) * (uint)uVar3;
        uVar23 = uVar13 - uVar14;
        if (uVar13 < uVar14) {
          pUVar5[(ulong)uVar28 + 0xcc] = (short)(0x800 - uVar3 >> 5) + uVar3;
          if (uVar14 < 0x1000000) {
            uVar14 = uVar14 * 0x100;
            bVar1 = *pbVar24;
            pbVar24 = pbVar24 + 1;
            uVar13 = (uint)bVar1 | uVar13 << 8;
          }
          uVar3 = pUVar5[uVar31 + uVar29 + 0xf0];
          uVar25 = (uVar14 >> 0xb) * (uint)uVar3;
          uVar23 = uVar13 - uVar25;
          if (uVar13 < uVar25) {
            pUVar5[uVar31 + uVar29 + 0xf0] = (short)(0x800 - uVar3 >> 5) + uVar3;
            uVar29 = 0;
            if (SVar32 < local_d4) {
              uVar29 = uVar17;
            }
            pBVar6[SVar32] = pBVar6[uVar29 + (SVar32 - local_d4)];
            uVar28 = (uint)(6 < uVar28) * 2 + 9;
            goto LAB_00193ca9;
          }
          uVar14 = uVar14 - uVar25;
          pUVar5[uVar31 + uVar29 + 0xf0] = uVar3 - (uVar3 >> 5);
          uVar15 = local_cc;
        }
        else {
          uVar25 = uVar25 - uVar14;
          pUVar5[(ulong)uVar28 + 0xcc] = uVar3 - (uVar3 >> 5);
          if (uVar25 < 0x1000000) {
            uVar25 = uVar25 * 0x100;
            bVar1 = *pbVar24;
            pbVar24 = pbVar24 + 1;
            uVar23 = uVar23 * 0x100 | (uint)bVar1;
          }
          uVar3 = pUVar5[(ulong)uVar28 + 0xd8];
          uVar14 = (uVar25 >> 0xb) * (uint)uVar3;
          uVar13 = uVar23 - uVar14;
          if (uVar23 < uVar14) {
            pUVar5[(ulong)uVar28 + 0xd8] = (short)(0x800 - uVar3 >> 5) + uVar3;
            local_d4 = local_cc;
          }
          else {
            uVar25 = uVar25 - uVar14;
            pUVar5[(ulong)uVar28 + 0xd8] = uVar3 - (uVar3 >> 5);
            if (uVar25 < 0x1000000) {
              uVar25 = uVar25 * 0x100;
              bVar1 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar13 = uVar13 * 0x100 | (uint)bVar1;
            }
            uVar3 = pUVar5[(ulong)uVar28 + 0xe4];
            uVar14 = (uVar25 >> 0xb) * (uint)uVar3;
            uVar23 = uVar13 - uVar14;
            if (uVar13 < uVar14) {
              sVar7 = (short)(0x800 - uVar3 >> 5);
              uVar23 = uVar13;
              uVar27 = local_d0;
            }
            else {
              uVar14 = uVar25 - uVar14;
              sVar7 = -(uVar3 >> 5);
              local_c8 = local_d0;
            }
            pUVar5[(ulong)uVar28 + 0xe4] = sVar7 + uVar3;
            local_d0 = local_cc;
            local_d4 = uVar27;
          }
        }
        uVar28 = (uint)(6 < uVar28) * 3 + 8;
        puVar30 = pUVar5 + 0x534;
        local_cc = uVar15;
      }
      uVar3 = *puVar30;
      if (uVar14 < 0x1000000) {
        uVar14 = uVar14 << 8;
        bVar1 = *pbVar24;
        pbVar24 = pbVar24 + 1;
        uVar23 = uVar23 << 8 | (uint)bVar1;
      }
      uVar25 = (uVar14 >> 0xb) * (uint)uVar3;
      uVar15 = uVar23 - uVar25;
      if (uVar23 < uVar25) {
        *puVar30 = (short)(0x800 - uVar3 >> 5) + uVar3;
        puVar30 = puVar30 + (ulong)(uVar19 << 3) + 2;
        iVar16 = 0;
        uVar27 = 8;
        uVar13 = uVar23;
      }
      else {
        uVar14 = uVar14 - uVar25;
        *puVar30 = uVar3 - (uVar3 >> 5);
        if (uVar14 < 0x1000000) {
          uVar14 = uVar14 * 0x100;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar15 = (uint)bVar1 | uVar15 * 0x100;
        }
        uVar3 = puVar30[1];
        uVar25 = (uVar14 >> 0xb) * (uint)uVar3;
        uVar13 = uVar15 - uVar25;
        if (uVar15 < uVar25) {
          puVar30[1] = (short)(0x800 - uVar3 >> 5) + uVar3;
          puVar30 = puVar30 + (ulong)(uVar19 << 3) + 0x82;
          uVar27 = 8;
          iVar16 = 8;
          uVar13 = uVar15;
        }
        else {
          uVar25 = uVar14 - uVar25;
          puVar30[1] = uVar3 - (uVar3 >> 5);
          puVar30 = puVar30 + 0x102;
          iVar16 = 0x10;
          uVar27 = 0x100;
        }
      }
      uVar22 = 1;
      do {
        uVar3 = puVar30[uVar22];
        uVar15 = uVar25;
        uVar23 = uVar13;
        if (uVar25 < 0x1000000) {
          uVar15 = uVar25 << 8;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar23 = uVar13 << 8 | (uint)bVar1;
        }
        uVar25 = (uVar15 >> 0xb) * (uint)uVar3;
        uVar14 = (int)uVar22 * 2;
        uVar13 = uVar23 - uVar25;
        if (uVar23 < uVar25) {
          puVar30[uVar22] = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar13 = uVar23;
        }
        else {
          uVar25 = uVar15 - uVar25;
          puVar30[uVar22] = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar22 = (ulong)uVar14;
      } while (uVar14 < uVar27);
      uVar15 = (uVar14 - uVar27) + iVar16;
      uVar22 = (ulong)uVar15;
      if (0xb < uVar28) {
        uVar27 = 3;
        if (uVar15 < 3) {
          uVar27 = uVar15;
        }
        if (uVar25 < 0x1000000) {
          uVar25 = uVar25 << 8;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar13 = (uint)bVar1 | uVar13 << 8;
        }
        uVar29 = (ulong)(uVar27 << 7);
        uVar3 = *(ushort *)((long)pUVar5 + uVar29 + 0x362);
        uVar23 = (uVar25 >> 0xb) * (uint)uVar3;
        uVar27 = uVar13 - uVar23;
        if (uVar13 < uVar23) {
          sVar7 = (short)(0x800 - uVar3 >> 5);
          uVar14 = 2;
          uVar27 = uVar13;
        }
        else {
          uVar23 = uVar25 - uVar23;
          sVar7 = -(uVar3 >> 5);
          uVar14 = 3;
        }
        lVar9 = uVar29 + 0x360;
        *(ushort *)((long)pUVar5 + uVar29 + 0x362) = sVar7 + uVar3;
        if (uVar23 < 0x1000000) {
          uVar23 = uVar23 << 8;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar27 = (uint)bVar1 | uVar27 << 8;
        }
        uVar29 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9);
        uVar13 = (uVar23 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar25 = uVar27 - uVar13;
        if (uVar27 < uVar13) {
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar25 = uVar27;
        }
        else {
          uVar13 = uVar23 - uVar13;
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar29 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9);
        if (uVar13 < 0x1000000) {
          uVar13 = uVar13 << 8;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar25 = (uint)bVar1 | uVar25 << 8;
        }
        uVar23 = (uVar13 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar27 = uVar25 - uVar23;
        if (uVar25 < uVar23) {
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar27 = uVar25;
        }
        else {
          uVar23 = uVar13 - uVar23;
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar29 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9);
        if (uVar23 < 0x1000000) {
          uVar23 = uVar23 << 8;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar27 = (uint)bVar1 | uVar27 << 8;
        }
        uVar13 = (uVar23 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar25 = uVar27 - uVar13;
        if (uVar27 < uVar13) {
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar25 = uVar27;
        }
        else {
          uVar13 = uVar23 - uVar13;
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar29 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9);
        if (uVar13 < 0x1000000) {
          uVar13 = uVar13 << 8;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar25 = (uint)bVar1 | uVar25 << 8;
        }
        uVar23 = (uVar13 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar27 = uVar25 - uVar23;
        if (uVar25 < uVar23) {
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar27 = uVar25;
        }
        else {
          uVar23 = uVar13 - uVar23;
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar29 = (ulong)uVar14;
        uVar3 = *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9);
        if (uVar23 < 0x1000000) {
          uVar23 = uVar23 << 8;
          bVar1 = *pbVar24;
          pbVar24 = pbVar24 + 1;
          uVar27 = (uint)bVar1 | uVar27 << 8;
        }
        uVar25 = (uVar23 >> 0xb) * (uint)uVar3;
        uVar14 = uVar14 * 2;
        uVar13 = uVar27 - uVar25;
        if (uVar27 < uVar25) {
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = (short)(0x800 - uVar3 >> 5) + uVar3;
          uVar13 = uVar27;
        }
        else {
          uVar25 = uVar23 - uVar25;
          *(ushort *)((long)pUVar5 + uVar29 * 2 + lVar9) = uVar3 - (uVar3 >> 5);
          uVar14 = uVar14 | 1;
        }
        uVar27 = uVar14 - 0x40;
        if (uVar27 < 4) {
LAB_001945d6:
          uVar15 = UVar33;
          if (uVar4 != 0) {
            uVar15 = uVar4;
          }
          if (uVar27 < uVar15) {
            uVar28 = (uint)(0x12 < uVar28) * 3 + 7;
          }
          cVar12 = uVar27 >= uVar15;
          local_c8 = local_d0;
          local_d0 = local_cc;
          local_cc = local_d4;
          local_d4 = uVar27 + 1;
        }
        else {
          uVar23 = uVar14 & 1 | 2;
          if (uVar27 < 0xe) {
            iVar16 = (uVar27 >> 1) - 1;
            uVar26 = (ulong)(uVar23 << ((byte)iVar16 & 0x1f));
            uVar31 = (ulong)uVar27;
            uVar15 = 1;
            uVar34 = 1;
            uVar29 = uVar26;
            do {
              uVar27 = uVar25;
              if (uVar25 < 0x1000000) {
                uVar27 = uVar25 << 8;
                bVar1 = *pbVar24;
                pbVar24 = pbVar24 + 1;
                uVar13 = uVar13 << 8 | (uint)bVar1;
              }
              uVar3 = pUVar5[uVar26 + ((uVar34 + 0x2af) - uVar31)];
              uVar25 = (uVar27 >> 0xb) * (uint)uVar3;
              uVar23 = (int)uVar34 * 2;
              uVar14 = uVar13 - uVar25;
              if (uVar13 < uVar25) {
                pUVar5[uVar26 + ((uVar34 + 0x2af) - uVar31)] = (short)(0x800 - uVar3 >> 5) + uVar3;
              }
              else {
                uVar25 = uVar27 - uVar25;
                pUVar5[uVar26 + ((uVar34 + 0x2af) - uVar31)] = uVar3 - (uVar3 >> 5);
                uVar23 = uVar23 | 1;
                uVar29 = (ulong)((uint)uVar29 | uVar15);
                uVar13 = uVar14;
              }
              uVar27 = (uint)uVar29;
              uVar34 = (ulong)uVar23;
              uVar15 = uVar15 * 2;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
            cVar12 = '\0';
            bVar8 = true;
          }
          else {
            iVar16 = (uVar27 >> 1) - 5;
            do {
              uVar27 = uVar25;
              if (uVar25 < 0x1000000) {
                bVar1 = *pbVar24;
                pbVar24 = pbVar24 + 1;
                uVar13 = (uint)bVar1 | uVar13 << 8;
                uVar27 = uVar25 << 8;
              }
              uVar25 = uVar27 >> 1;
              uVar14 = (int)(uVar13 - uVar25) >> 0x1f;
              uVar23 = uVar14 + uVar23 * 2 + 1;
              uVar13 = (uVar14 & uVar25) + (uVar13 - uVar25);
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
            if (uVar27 < 0x2000000) {
              uVar25 = uVar25 << 8;
              bVar1 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar13 = (uint)bVar1 | uVar13 * 0x100;
            }
            uVar27 = uVar23 * 0x10;
            uVar3 = pUVar5[0x323];
            uVar14 = (uVar25 >> 0xb) * (uint)uVar3;
            uVar23 = uVar13 - uVar14;
            if (uVar13 < uVar14) {
              pUVar5[0x323] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar25 = 2;
              uVar23 = uVar13;
            }
            else {
              uVar14 = uVar25 - uVar14;
              pUVar5[0x323] = uVar3 - (uVar3 >> 5);
              uVar27 = uVar27 | 1;
              uVar25 = 3;
            }
            if (uVar14 < 0x1000000) {
              uVar14 = uVar14 << 8;
              bVar1 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar23 = (uint)bVar1 | uVar23 << 8;
            }
            uVar3 = pUVar5[(ulong)uVar25 + 0x322];
            uVar21 = (uVar14 >> 0xb) * (uint)uVar3;
            uVar13 = uVar25 * 2;
            uVar19 = uVar23 - uVar21;
            if (uVar23 < uVar21) {
              pUVar5[(ulong)uVar25 + 0x322] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar19 = uVar23;
            }
            else {
              uVar21 = uVar14 - uVar21;
              pUVar5[(ulong)uVar25 + 0x322] = uVar3 - (uVar3 >> 5);
              uVar13 = uVar13 | 1;
              uVar27 = uVar27 | 2;
            }
            uVar3 = pUVar5[(ulong)uVar13 + 0x322];
            if (uVar21 < 0x1000000) {
              uVar21 = uVar21 << 8;
              bVar1 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar19 = (uint)bVar1 | uVar19 << 8;
            }
            uVar14 = (uVar21 >> 0xb) * (uint)uVar3;
            uVar25 = uVar13 * 2;
            uVar23 = uVar19 - uVar14;
            if (uVar19 < uVar14) {
              pUVar5[(ulong)uVar13 + 0x322] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar23 = uVar19;
            }
            else {
              uVar14 = uVar21 - uVar14;
              pUVar5[(ulong)uVar13 + 0x322] = uVar3 - (uVar3 >> 5);
              uVar25 = uVar25 | 1;
              uVar27 = uVar27 | 4;
            }
            uVar29 = (ulong)uVar25;
            uVar3 = pUVar5[uVar29 + 0x322];
            if (uVar14 < 0x1000000) {
              uVar14 = uVar14 << 8;
              bVar1 = *pbVar24;
              pbVar24 = pbVar24 + 1;
              uVar23 = (uint)bVar1 | uVar23 << 8;
            }
            uVar25 = (uVar14 >> 0xb) * (uint)uVar3;
            uVar13 = uVar23 - uVar25;
            if (uVar23 < uVar25) {
              pUVar5[uVar29 + 0x322] = (short)(0x800 - uVar3 >> 5) + uVar3;
              uVar13 = uVar23;
            }
            else {
              uVar25 = uVar14 - uVar25;
              pUVar5[uVar29 + 0x322] = uVar3 - (uVar3 >> 5);
              uVar27 = uVar27 | 8;
            }
            if (uVar27 == 0xffffffff) {
              uVar22 = (ulong)(uVar15 + 0x112);
              uVar28 = uVar28 - 0xc;
              uVar27 = 0xffffffff;
              cVar12 = '\x02';
              bVar8 = false;
            }
            else {
              cVar12 = '\0';
              bVar8 = true;
            }
          }
          if (bVar8) goto LAB_001945d6;
        }
        uVar15 = (uint)uVar22;
        if (cVar12 != '\0') goto LAB_001946d1;
      }
      uVar15 = uVar15 + 2;
      uVar22 = (ulong)uVar15;
      cVar12 = '\x01';
      uVar29 = local_90 - SVar32;
      if (uVar29 != 0) {
        uVar31 = uVar29 & 0xffffffff;
        if (uVar22 <= uVar29) {
          uVar31 = (ulong)uVar15;
        }
        uVar29 = 0;
        if (SVar32 < local_d4) {
          uVar29 = uVar17;
        }
        uVar29 = (SVar32 - local_d4) + uVar29;
        UVar33 = UVar33 + (int)uVar31;
        uVar22 = (ulong)(uVar15 - (int)uVar31);
        if (uVar17 < uVar29 + uVar31) {
          do {
            pBVar6[SVar32] = pBVar6[uVar29];
            SVar32 = SVar32 + 1;
            uVar29 = uVar29 + 1;
            cVar12 = '\0';
            if (uVar29 == uVar17) {
              uVar29 = 0;
            }
            uVar15 = (int)uVar31 - 1;
            uVar31 = (ulong)uVar15;
          } while (uVar15 != 0);
        }
        else {
          pBVar18 = pBVar6 + SVar32;
          uVar26 = uVar31;
          do {
            *pBVar18 = pBVar18[uVar29 - SVar32];
            pBVar18 = pBVar18 + 1;
            uVar26 = uVar26 - 1;
          } while (uVar26 != 0);
          SVar32 = SVar32 + uVar31;
          cVar12 = '\0';
        }
      }
    }
LAB_001946d1:
    if ((cVar12 == '\0') || (cVar12 == '\x03')) {
      if ((local_90 <= SVar32) || (bufLimit <= pbVar24)) goto LAB_001946f3;
      goto LAB_00193a32;
    }
    if (cVar12 != '\x02') {
      iVar16 = 1;
      bVar8 = true;
      goto LAB_00194765;
    }
LAB_001946f3:
    if (uVar25 < 0x1000000) {
      uVar25 = uVar25 << 8;
      bVar2 = *pbVar24;
      pbVar24 = pbVar24 + 1;
      uVar13 = (uint)bVar2 | uVar13 << 8;
    }
    p->buf = pbVar24;
    p->range = uVar25;
    p->code = uVar13;
    p->remainLen = (uint)uVar22;
    p->dicPos = SVar32;
    p->processedPos = UVar33;
    p->reps[0] = local_d4;
    p->reps[1] = local_cc;
    p->reps[2] = local_d0;
    p->reps[3] = local_c8;
    p->state = uVar28;
    bVar8 = false;
    iVar16 = 0;
LAB_00194765:
    if (bVar8) {
      return iVar16;
    }
    uVar4 = (p->prop).dicSize;
    if (uVar4 <= p->processedPos) {
      p->checkDicSize = uVar4;
    }
    LzmaDec_WriteRem(p,limit);
    if (((limit <= p->dicPos) || (bufLimit <= p->buf)) || (0x111 < p->remainLen)) {
      if (0x112 < p->remainLen) {
        p->remainLen = 0x112;
      }
      return 0;
    }
  } while( true );
}

Assistant:

static int MY_FAST_CALL LzmaDec_DecodeReal2(CLzmaDec* p, SizeT limit, const Byte* bufLimit) {
  do {
    SizeT limit2 = limit;
    if (p->checkDicSize == 0) {
      UInt32 rem = p->prop.dicSize - p->processedPos;
      if (limit - p->dicPos > rem)
        limit2 = p->dicPos + rem;
    }
    RINOK(LzmaDec_DecodeReal(p, limit2, bufLimit));
    if (p->processedPos >= p->prop.dicSize)
      p->checkDicSize = p->prop.dicSize;
    LzmaDec_WriteRem(p, limit);
  } while (p->dicPos < limit && p->buf < bufLimit && p->remainLen < kMatchSpecLenStart);

  if (p->remainLen > kMatchSpecLenStart) {
    p->remainLen = kMatchSpecLenStart;
  }
  return 0;
}